

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O0

optional<double> __thiscall
yactfr::internal::StrScanner::tryScanConstReal<true,false>(StrScanner *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  int *piVar2;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar3;
  optional<double> oVar4;
  double local_38;
  double val;
  char *strEnd;
  StrScanner *local_20;
  StrScanner *this_local;
  double local_10;
  
  local_20 = this;
  skipCommentsAndWhitespaces<true,false>(this);
  bVar1 = std::regex_search<char_const*,char,std::__cxx11::regex_traits<char>>
                    (this->_at,this->_end,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)_realRegex_abi_cxx11_,0
                    );
  if (bVar1) {
    val = 0.0;
    local_38 = strtod(this->_at,(char **)&val);
    if ((((local_38 == INFINITY) && (!NAN(local_38))) ||
        ((local_38 == 0.0 && ((!NAN(local_38) && (this->_at == (char *)val)))))) ||
       (piVar2 = __errno_location(), *piVar2 == 0x22)) {
      piVar2 = __errno_location();
      *piVar2 = 0;
      boost::optional<double>::optional((optional<double> *)&this_local);
      uVar3 = extraout_RAX_00;
    }
    else {
      this->_at = this->_at + ((long)val - (long)this->_at);
      boost::optional<double>::optional((optional<double> *)&this_local,&local_38);
      uVar3 = extraout_RAX_01;
    }
  }
  else {
    boost::optional<double>::optional((optional<double> *)&this_local);
    uVar3 = extraout_RAX;
  }
  oVar4.super_type._1_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super_type.m_initialized = (bool)this_local._0_1_;
  oVar4.super_type.m_storage = local_10;
  return (optional<double>)oVar4.super_type;
}

Assistant:

boost::optional<double> StrScanner::tryScanConstReal()
{
    this->skipCommentsAndWhitespaces<SkipWsV, SkipCommentsV>();

    /*
     * Validate JSON number format (with fraction and/or exponent part).
     *
     * This is needed because std::strtod() accepts more formats which
     * JSON doesn't support.
     */
    if (!std::regex_search(_at, _end, StrScanner::_realRegex)) {
        return boost::none;
    }

    // parse
    char *strEnd = nullptr;
    const auto val = std::strtod(_at, &strEnd);

    if (val == HUGE_VAL || (val == 0 && &(*_at) == strEnd) || errno == ERANGE) {
        // could not parse
        errno = 0;
        return boost::none;
    }

    // success: update position and return value
    _at += (strEnd - &(*_at));
    return val;
}